

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathVec.h
# Opt level: O0

float __thiscall Imath_2_5::Vec3<float>::lengthTiny(Vec3<float> *this)

{
  float *in_RDI;
  double dVar1;
  float max;
  float absZ;
  float absY;
  float absX;
  float local_34;
  float local_30;
  float local_2c;
  float local_20;
  float local_4;
  
  if (*in_RDI < 0.0) {
    local_2c = -*in_RDI;
  }
  else {
    local_2c = *in_RDI;
  }
  if (in_RDI[1] < 0.0) {
    local_30 = -in_RDI[1];
  }
  else {
    local_30 = in_RDI[1];
  }
  if (in_RDI[2] < 0.0) {
    local_34 = -in_RDI[2];
  }
  else {
    local_34 = in_RDI[2];
  }
  local_20 = local_2c;
  if (local_2c < local_30) {
    local_20 = local_30;
  }
  if (local_20 < local_34) {
    local_20 = local_34;
  }
  if ((local_20 != 0.0) || (NAN(local_20))) {
    dVar1 = Math<float>::sqrt((double)(ulong)(uint)((local_34 / local_20) * (local_34 / local_20) +
                                                   (local_2c / local_20) * (local_2c / local_20) +
                                                   (local_30 / local_20) * (local_30 / local_20)));
    local_4 = local_20 * SUB84(dVar1,0);
  }
  else {
    local_4 = 0.0;
  }
  return local_4;
}

Assistant:

T
Vec3<T>::lengthTiny () const
{
    T absX = (x >= T (0))? x: -x;
    T absY = (y >= T (0))? y: -y;
    T absZ = (z >= T (0))? z: -z;
    
    T max = absX;

    if (max < absY)
	max = absY;

    if (max < absZ)
	max = absZ;

    if (max == T (0))
	return T (0);

    //
    // Do not replace the divisions by max with multiplications by 1/max.
    // Computing 1/max can overflow but the divisions below will always
    // produce results less than or equal to 1.
    //

    absX /= max;
    absY /= max;
    absZ /= max;

    return max * Math<T>::sqrt (absX * absX + absY * absY + absZ * absZ);
}